

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

ON_UUID __thiscall ONX_Model::CurrentDimensionStyleId(ONX_Model *this)

{
  bool bVar1;
  ON_DimStyle *this_00;
  ON_UUID *pOVar2;
  uchar auVar3 [8];
  ON_UUID *pOVar4;
  uchar auVar5 [8];
  ON_UUID OVar6;
  ON_UUID component_model_id;
  ON_UUID id;
  ON_ModelComponentReference cr;
  ON_UUID local_48;
  ON_UUID in_stack_ffffffffffffffc8;
  
  pOVar4 = &local_48;
  local_48 = ON_3dmSettings::CurrentDimensionStyleId(&this->m_settings);
  bVar1 = ::operator==(&ON_nil_uuid,&local_48);
  auVar3 = local_48.Data4;
  auVar5 = (uchar  [8])local_48._0_8_;
  if (!bVar1) {
    this_00 = ON_DimStyle::SystemDimstyleFromId(in_stack_ffffffffffffffc8);
    pOVar2 = ON_ModelComponent::Id(&this_00->super_ON_ModelComponent);
    bVar1 = ::operator==(&local_48,pOVar2);
    if (bVar1) {
      auVar3 = local_48.Data4;
      auVar5 = (uchar  [8])local_48._0_8_;
    }
    else {
      component_model_id.Data4 = (uchar  [8])local_48._0_8_;
      component_model_id.Data1 = 8;
      component_model_id.Data2 = 0;
      component_model_id.Data3 = 0;
      ComponentFromId((ONX_Model *)&stack0xffffffffffffffc8,(Type)this,component_model_id);
      bVar1 = ON_ModelComponentReference::IsEmpty
                        ((ON_ModelComponentReference *)&stack0xffffffffffffffc8);
      pOVar2 = &ON_nil_uuid;
      if (!bVar1) {
        pOVar2 = &local_48;
      }
      auVar3 = *&pOVar2->Data4;
      if (bVar1) {
        pOVar4 = &ON_nil_uuid;
      }
      auVar5 = *(uchar (*) [8])pOVar4;
      ON_ModelComponentReference::~ON_ModelComponentReference
                ((ON_ModelComponentReference *)&stack0xffffffffffffffc8);
    }
  }
  OVar6.Data4[0] = auVar3[0];
  OVar6.Data4[1] = auVar3[1];
  OVar6.Data4[2] = auVar3[2];
  OVar6.Data4[3] = auVar3[3];
  OVar6.Data4[4] = auVar3[4];
  OVar6.Data4[5] = auVar3[5];
  OVar6.Data4[6] = auVar3[6];
  OVar6.Data4[7] = auVar3[7];
  OVar6._0_8_ = auVar5;
  return OVar6;
}

Assistant:

ON_UUID ONX_Model::CurrentDimensionStyleId() const
{
  const ON_UUID id = m_settings.CurrentDimensionStyleId();
  if (ON_nil_uuid == id)
    return id;
  if (id == ON_DimStyle::SystemDimstyleFromId(id).Id())
    return id;
  const ON_ModelComponentReference cr = ComponentFromId(ON_ModelComponent::Type::DimStyle,id);
  if (false == cr.IsEmpty())
    return id;
  return ON_nil_uuid;
}